

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FileOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  MessageLite *to_msg_00;
  void *pvVar3;
  Arena *pAVar4;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar5 = from_msg;
    MergeImpl();
    pAVar4 = extraout_RDX;
LAB_0023138f:
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
LAB_002310ac:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar5,value,pAVar4);
  }
  else {
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
                 Arena::CopyConstruct<google::protobuf::UninterpretedOption>);
    }
    unaff_EBP = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((char)unaff_EBP == '\0') goto LAB_002311d1;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[4]._internal_metadata_.ptr_;
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar5 = (MessageLite *)&to_msg[4]._internal_metadata_;
      pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar4 & 1) != 0) goto LAB_0023138f;
      goto LAB_002310ac;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pp_Var2 = from_msg[5]._vptr_MessageLite;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 2;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 5),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4
              );
  }
  if ((unaff_EBP & 4) != 0) {
    uVar1 = from_msg[5]._internal_metadata_.ptr_;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 4;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[5]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar4);
  }
  if ((unaff_EBP & 8) != 0) {
    pp_Var2 = from_msg[6]._vptr_MessageLite;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 8;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 6),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4
              );
  }
  if ((unaff_EBP & 0x10) != 0) {
    uVar1 = from_msg[6]._internal_metadata_.ptr_;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 0x10;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[6]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar4);
  }
  if ((unaff_EBP & 0x20) != 0) {
    pp_Var2 = from_msg[7]._vptr_MessageLite;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 0x20;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 7),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4
              );
  }
  if ((unaff_EBP & 0x40) != 0) {
    uVar1 = from_msg[7]._internal_metadata_.ptr_;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 0x40;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[7]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar4);
  }
  if ((char)unaff_EBP < '\0') {
    pp_Var2 = from_msg[8]._vptr_MessageLite;
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 0x80;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 8),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4
              );
  }
LAB_002311d1:
  if ((unaff_EBP & 0xff00) != 0) {
    if ((unaff_EBP >> 8 & 1) != 0) {
      uVar1 = from_msg[8]._internal_metadata_.ptr_;
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
           (uint)to_msg[2]._internal_metadata_.ptr_ | 0x100;
      pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[8]._internal_metadata_,
                 (string *)(uVar1 & 0xfffffffffffffffc),pAVar4);
    }
    if ((unaff_EBP >> 9 & 1) != 0) {
      pp_Var2 = from_msg[9]._vptr_MessageLite;
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
           (uint)to_msg[2]._internal_metadata_.ptr_ | 0x200;
      pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 9),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
                 pAVar4);
    }
    if ((unaff_EBP >> 10 & 1) != 0) {
      pMVar5 = (MessageLite *)from_msg[9]._internal_metadata_.ptr_;
      if (pMVar5 == (MessageLite *)0x0) {
        MergeImpl((FileOptions *)&stack0xffffffffffffffd0);
        return;
      }
      to_msg_00 = (MessageLite *)to_msg[9]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar3 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar5);
        to_msg[9]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
      }
      else {
        FeatureSet::MergeImpl(to_msg_00,pMVar5);
      }
    }
    if ((unaff_EBP >> 0xb & 1) != 0) {
      *(undefined1 *)&to_msg[10]._vptr_MessageLite = *(undefined1 *)&from_msg[10]._vptr_MessageLite;
    }
    if ((unaff_EBP >> 0xc & 1) != 0) {
      *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 1) =
           *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 1);
    }
    if ((unaff_EBP >> 0xd & 1) != 0) {
      *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 2) =
           *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 2);
    }
    if ((unaff_EBP >> 0xe & 1) != 0) {
      *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 3) =
           *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 3);
    }
    if ((short)unaff_EBP < 0) {
      *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 4) =
           *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 4);
    }
  }
  if ((unaff_EBP & 0xf0000) != 0) {
    if ((unaff_EBP >> 0x10 & 1) != 0) {
      *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 5) =
           *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 5);
    }
    if ((unaff_EBP >> 0x11 & 1) != 0) {
      *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 6) =
           *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 6);
    }
    if ((unaff_EBP >> 0x12 & 1) != 0) {
      *(int *)&to_msg[10]._internal_metadata_.ptr_ = (int)from_msg[10]._internal_metadata_.ptr_;
    }
    if ((unaff_EBP >> 0x13 & 1) != 0) {
      *(undefined1 *)((long)&to_msg[10]._internal_metadata_.ptr_ + 4) =
           *(undefined1 *)((long)&from_msg[10]._internal_metadata_.ptr_ + 4);
    }
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
       (uint)to_msg[2]._internal_metadata_.ptr_ | unaff_EBP;
  internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)&_FileOptions_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void FileOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileOptions*>(&to_msg);
  auto& from = static_cast<const FileOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _this->_internal_set_java_package(from._internal_java_package());
    }
    if (cached_has_bits & 0x00000002u) {
      _this->_internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if (cached_has_bits & 0x00000004u) {
      _this->_internal_set_go_package(from._internal_go_package());
    }
    if (cached_has_bits & 0x00000008u) {
      _this->_internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if (cached_has_bits & 0x00000010u) {
      _this->_internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if (cached_has_bits & 0x00000020u) {
      _this->_internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if (cached_has_bits & 0x00000040u) {
      _this->_internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if (cached_has_bits & 0x00000080u) {
      _this->_internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _this->_internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if (cached_has_bits & 0x00000200u) {
      _this->_internal_set_ruby_package(from._internal_ruby_package());
    }
    if (cached_has_bits & 0x00000400u) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ =
            ::google::protobuf::Message::CopyConstruct<::google::protobuf::FeatureSet>(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if (cached_has_bits & 0x00000800u) {
      _this->_impl_.java_multiple_files_ = from._impl_.java_multiple_files_;
    }
    if (cached_has_bits & 0x00001000u) {
      _this->_impl_.java_generate_equals_and_hash_ = from._impl_.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00002000u) {
      _this->_impl_.java_string_check_utf8_ = from._impl_.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00004000u) {
      _this->_impl_.cc_generic_services_ = from._impl_.cc_generic_services_;
    }
    if (cached_has_bits & 0x00008000u) {
      _this->_impl_.java_generic_services_ = from._impl_.java_generic_services_;
    }
  }
  if (cached_has_bits & 0x000f0000u) {
    if (cached_has_bits & 0x00010000u) {
      _this->_impl_.py_generic_services_ = from._impl_.py_generic_services_;
    }
    if (cached_has_bits & 0x00020000u) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if (cached_has_bits & 0x00040000u) {
      _this->_impl_.optimize_for_ = from._impl_.optimize_for_;
    }
    if (cached_has_bits & 0x00080000u) {
      _this->_impl_.cc_enable_arenas_ = from._impl_.cc_enable_arenas_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(internal_default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}